

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_image::set_pixel(dxt_image *this,uint x,uint y,color_quad_u8 *c,bool perceptual)

{
  etc1_block *this_00;
  byte bVar1;
  uint16 uVar2;
  uint16 packed_delta3;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  uint x_00;
  ulong uVar6;
  uint uVar7;
  color_quad_u8 *pcVar8;
  ulong uVar9;
  color_quad_u8 *pcVar10;
  uint uVar11;
  color_quad_u8 *pcVar12;
  uint uVar13;
  dxt5_block *pDXT5_block;
  dxt5_block *this_01;
  ulong uVar14;
  long lVar15;
  uint y_00;
  uint uVar16;
  color_quad_u8 colors [4];
  color_quad_u8 subblock_colors1 [4];
  
  uVar16 = this->m_num_elements_per_block;
  this_01 = (dxt5_block *)(this->m_pElements + (this->m_blocks_x * (y >> 2) + (x >> 2)) * uVar16);
  x_00 = x & 3;
  y_00 = y & 3;
  bVar4 = (char)x * '\x02' & 6;
  bVar5 = (byte)(3 << bVar4);
  pcVar12 = colors;
  if (y_00 == 3) {
    pcVar12 = subblock_colors1;
  }
  pcVar10 = colors;
  if (x_00 == 3) {
    pcVar10 = subblock_colors1;
  }
  for (uVar9 = 0; uVar9 < uVar16; uVar9 = uVar9 + 1) {
    switch(this->m_element_type[uVar9]) {
    case cColorDXT1:
      uVar7 = dxt1_block::get_block_colors
                        (colors,*(uint16 *)this_01->m_endpoints,*(uint16 *)this_01->m_selectors);
      if ((this->m_format == cDXT1A) && (-1 < (char)(c->field_0).field_0.a)) {
        this_01->m_selectors[(ulong)y_00 + 2] = this_01->m_selectors[(ulong)y_00 + 2] | bVar5;
      }
      else {
        pcVar8 = colors;
        uVar16 = 0xffffffff;
        uVar6 = 0;
        for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
          uVar3 = crnlib::color::color_distance(perceptual,pcVar8,c,false);
          if (uVar3 < uVar16) {
            uVar6 = uVar14 & 0xffffffff;
            uVar16 = uVar3;
          }
          pcVar8 = pcVar8 + 1;
        }
        this_01->m_selectors[(ulong)y_00 + 2] =
             (byte)((int)uVar6 << bVar4) | this_01->m_selectors[(ulong)y_00 + 2] & ~bVar5;
      }
      break;
    case cAlphaDXT3:
      dxt3_block::set_alpha
                ((dxt3_block *)this_01,x_00,y_00,
                 (uint)(c->field_0).c[(uint)(int)this->m_element_component_index[uVar9]],true);
      break;
    case cAlphaDXT5:
      dxt5_block::get_block_values
                ((uint *)colors,(uint)this_01->m_endpoints[0],(uint)this_01->m_endpoints[1]);
      uVar16 = 0xffffffff;
      uVar14 = 0;
      for (uVar6 = 0; uVar6 != 8; uVar6 = uVar6 + 1) {
        uVar11 = colors[uVar6].field_0.m_u32 -
                 (uint)(c->field_0).c[(uint)(int)this->m_element_component_index[uVar9]];
        uVar13 = -uVar11;
        if (0 < (int)uVar11) {
          uVar13 = uVar11;
        }
        if (uVar13 < uVar16) {
          uVar14 = uVar6 & 0xffffffff;
          uVar16 = uVar13;
        }
      }
      dxt5_block::set_selector(this_01,x_00,y_00,(uint)uVar14);
      break;
    case cColorETC1:
      this_00 = (etc1_block *)
                (this->m_pElements +
                ((int)uVar9 + (this->m_blocks_x * (y >> 2) + (x >> 2)) * uVar16));
      bVar1 = (this_00->field_0).m_bytes[3];
      uVar16 = bVar1 >> 2 & 7;
      if ((bVar1 & 2) == 0) {
        uVar2 = etc1_block::get_base4_color(this_00,0);
        etc1_block::get_abs_subblock_colors(colors,uVar2,(uint)(bVar1 >> 5));
        uVar2 = etc1_block::get_base4_color(this_00,1);
        etc1_block::get_abs_subblock_colors(subblock_colors1,uVar2,uVar16);
      }
      else {
        uVar2 = etc1_block::get_base5_color(this_00);
        packed_delta3 = etc1_block::get_delta3_color(this_00);
        etc1_block::get_diff_subblock_colors(colors,uVar2,(uint)(bVar1 >> 5));
        etc1_block::get_diff_subblock_colors(subblock_colors1,uVar2,packed_delta3,uVar16);
      }
      pcVar8 = pcVar12;
      if ((bVar1 & 1) == 0) {
        pcVar8 = pcVar10;
      }
      uVar7 = 0;
      uVar16 = 0xffffffff;
      for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
        uVar3 = crnlib::color::color_distance(perceptual,pcVar8,c,false);
        if (uVar3 < uVar16) {
          uVar16 = uVar3;
          uVar7 = (uint)lVar15;
        }
        pcVar8 = pcVar8 + 1;
      }
      etc1_block::set_selector(this_00,x_00,y_00,uVar7);
    }
    this_01 = this_01 + 1;
    uVar16 = this->m_num_elements_per_block;
  }
  return;
}

Assistant:

void dxt_image::set_pixel(uint x, uint y, const color_quad_u8& c, bool perceptual)
    {
        CRNLIB_ASSERT((x < m_width) && (y < m_height));

        const uint block_x = x >> cDXTBlockShift;
        const uint block_y = y >> cDXTBlockShift;

        element* pElement = &get_element(block_x, block_y, 0);

        for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
        {
            switch (m_element_type[element_index])
            {
            case cColorETC1:
            {
                etc1_block& block = *reinterpret_cast<etc1_block*>(&get_element(block_x, block_y, element_index));

                const bool diff_flag = block.get_diff_bit();
                const bool flip_flag = block.get_flip_bit();
                const uint table_index0 = block.get_inten_table(0);
                const uint table_index1 = block.get_inten_table(1);
                color_quad_u8 subblock_colors0[4], subblock_colors1[4];

                if (diff_flag)
                {
                    const uint16 base_color5 = block.get_base5_color();
                    const uint16 delta_color3 = block.get_delta3_color();
                    etc1_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);
                    etc1_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1);
                }
                else
                {
                    const uint16 base_color4_0 = block.get_base4_color(0);
                    etc1_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);
                    const uint16 base_color4_1 = block.get_base4_color(1);
                    etc1_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
                }

                const uint bx = x & 3;
                const uint by = y & 3;

                color_quad_u8* pColors = subblock_colors1;
                if (flip_flag)
                {
                    if (by <= 2)
                    {
                        pColors = subblock_colors0;
                    }
                }
                else
                {
                    if (bx <= 2)
                    {
                        pColors = subblock_colors0;
                    }
                }

                uint best_error = UINT_MAX;
                uint best_selector = 0;

                for (uint i = 0; i < 4; i++)
                {
                    uint error = color::color_distance(perceptual, pColors[i], c, false);
                    if (error < best_error)
                    {
                        best_error = error;
                        best_selector = i;
                    }
                }

                block.set_selector(bx, by, best_selector);
                break;
            }
            case cColorDXT1:
            {
                dxt1_block* pDXT1_block = reinterpret_cast<dxt1_block*>(pElement);

                color_quad_u8 colors[cDXT1SelectorValues];
                const uint n = pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

                if ((m_format == cDXT1A) && (c.a < 128))
                {
                    pDXT1_block->set_selector(x & 3, y & 3, 3);
                }
                else
                {
                    uint best_error = UINT_MAX;
                    uint best_selector = 0;

                    for (uint i = 0; i < n; i++)
                    {
                        uint error = color::color_distance(perceptual, colors[i], c, false);
                        if (error < best_error)
                        {
                            best_error = error;
                            best_selector = i;
                        }
                    }

                    pDXT1_block->set_selector(x & 3, y & 3, best_selector);
                }

                break;
            }
            case cAlphaDXT5:
            {
                dxt5_block* pDXT5_block = reinterpret_cast<dxt5_block*>(pElement);

                uint values[cDXT5SelectorValues];
                dxt5_block::get_block_values(values, pDXT5_block->get_low_alpha(), pDXT5_block->get_high_alpha());

                const int comp_index = m_element_component_index[element_index];

                uint best_error = UINT_MAX;
                uint best_selector = 0;

                for (uint i = 0; i < cDXT5SelectorValues; i++)
                {
                    uint error = labs((int)values[i] - (int)c[comp_index]); // no need to square

                    if (error < best_error)
                    {
                        best_error = error;
                        best_selector = i;
                    }
                }

                pDXT5_block->set_selector(x & 3, y & 3, best_selector);

                break;
            }
            case cAlphaDXT3:
            {
                const int comp_index = m_element_component_index[element_index];

                dxt3_block* pDXT3_block = reinterpret_cast<dxt3_block*>(pElement);

                pDXT3_block->set_alpha(x & 3, y & 3, c[comp_index], true);

                break;
            }
            default:
                break;
            }
        } // element_index
    }